

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O2

bool tcu::verifyTriangleGroupRasterization
               (Surface *surface,TriangleSceneSpec *scene,RasterizationArguments *args,TestLog *log,
               VerificationMode mode)

{
  int redBits;
  int greenBits;
  int blueBits;
  int aiVar1 [2];
  pointer pSVar2;
  ChannelType z;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  CoverageType CVar6;
  int iVar7;
  undefined4 uVar8;
  Surface *pSVar9;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  int x;
  uint subpixelBits;
  int y;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ChannelOrder y_00;
  long lVar14;
  uint uVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar25;
  int iVar26;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  IVec2 local_458;
  Vector<float,_2> local_450;
  VerificationMode local_448;
  uint local_444;
  RGBA triangleColor;
  RGBA backGroundColor;
  long local_438;
  Vector<float,_2> local_428;
  Vector<float,_2> local_420;
  Vector<float,_2> local_418;
  Vector<float,_2> local_410;
  Vector<float,_2> local_408;
  string local_400;
  string local_3e0;
  string local_3c0;
  Surface errorMask;
  float local_368;
  TextureLevel coverageMap;
  IVec4 aabb;
  string local_2c8;
  string local_2a8;
  string local_288;
  Vec2 screenSpace [3];
  undefined1 local_1b8 [8];
  Vector<float,_2> local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  triangleColor.m_value = 0xffffffff;
  backGroundColor.m_value = 0xff000000;
  iVar7 = args->numSamples;
  aiVar1[0] = surface->m_width;
  aiVar1[1] = surface->m_height;
  subpixelBits = args->subpixelBits;
  local_1b8._0_4_ = R;
  local_1b8._4_4_ = UNSIGNED_INT8;
  local_458.m_data = aiVar1;
  local_448 = mode;
  TextureLevel::TextureLevel(&coverageMap,(TextureFormat *)local_1b8,aiVar1[0],aiVar1[1],1);
  Surface::Surface(&errorMask,surface->m_width,surface->m_height);
  if ((int)subpixelBits < 0) {
    local_1b8 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    std::operator<<((ostream *)&local_1b0,"Invalid subpixel count (");
    std::ostream::operator<<((ostringstream *)&local_1b0,subpixelBits);
    std::operator<<((ostream *)&local_1b0,"), assuming 0");
    MessageBuilder::operator<<((MessageBuilder *)local_1b8,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
    subpixelBits = 0;
  }
  else if (0x10 < subpixelBits) {
    local_1b8 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    std::operator<<((ostream *)&local_1b0,"Subpixel count is greater than 16 (");
    std::ostream::operator<<((ostringstream *)&local_1b0,subpixelBits);
    std::operator<<((ostream *)&local_1b0,
                    "). Checking results using less strict 16 bit requirements. This may produce false positives."
                   );
    MessageBuilder::operator<<((MessageBuilder *)local_1b8,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
    subpixelBits = 0x10;
  }
  TextureLevel::getAccess((PixelBufferAccess *)local_1b8,&coverageMap);
  screenSpace._0_16_ = ZEXT416(2);
  clear((PixelBufferAccess *)local_1b8,(IVec4 *)screenSpace);
  fVar17 = (float)aiVar1[0];
  fVar25 = (float)aiVar1[1];
  local_438 = 0;
  lVar12 = 0;
  local_444 = subpixelBits;
  while( true ) {
    pSVar2 = (scene->triangles).
             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(scene->triangles).
                     super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 100) <= lVar12)
    break;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = *(ulong *)pSVar2[lVar12].positions[0].m_data;
    fVar18 = *(float *)((long)pSVar2[lVar12].positions[0].m_data + 0xc);
    auVar27._4_4_ = fVar18;
    auVar27._0_4_ = fVar18;
    auVar27._8_8_ = 0;
    auVar22 = divps(auVar22,auVar27);
    local_1b8 = auVar22._0_8_;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *(ulong *)pSVar2[lVar12].positions[1].m_data;
    fVar18 = *(float *)((long)(pSVar2[lVar12].positions + 1) + 0xc);
    auVar28._4_4_ = fVar18;
    auVar28._0_4_ = fVar18;
    auVar28._8_8_ = 0;
    auVar22 = divps(auVar23,auVar28);
    local_1b0.m_data = auVar22._0_8_;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = *(ulong *)pSVar2[lVar12].positions[2].m_data;
    fVar18 = *(float *)((long)(pSVar2[lVar12].positions + 2) + 0xc);
    auVar29._4_4_ = fVar18;
    auVar29._0_4_ = fVar18;
    auVar29._8_8_ = 0;
    auVar22 = divps(auVar24,auVar29);
    local_1a8[0]._0_8_ = auVar22._0_8_;
    local_400._M_dataplus._M_p = (pointer)0x3f8000003f800000;
    operator+((Vector<float,_2> *)local_1b8,(Vector<float,_2> *)&local_400);
    operator*(0.5,(Vector<float,_2> *)&local_3e0);
    local_288._M_dataplus._M_p = (pointer)CONCAT44(fVar25,fVar17);
    operator*((Vector<float,_2> *)&local_3c0,(Vector<float,_2> *)&local_288);
    local_450.m_data[0] = 1.0;
    local_450.m_data[1] = 1.0;
    operator+(&local_1b0,&local_450);
    operator*(0.5,(Vector<float,_2> *)&local_2c8);
    local_418.m_data[1] = fVar25;
    local_418.m_data[0] = fVar17;
    operator*((Vector<float,_2> *)&local_2a8,&local_418);
    local_420.m_data[0] = 1.0;
    local_420.m_data[1] = 1.0;
    operator+((Vector<float,_2> *)&local_1a8[0]._M_allocated_capacity,&local_420);
    operator*(0.5,&local_410);
    local_428.m_data[1] = fVar25;
    local_428.m_data[0] = fVar17;
    operator*(&local_408,&local_428);
    Vector<int,_4>::Vector(&aabb);
    fVar32 = screenSpace[1].m_data[0];
    fVar33 = screenSpace[1].m_data[1];
    fVar21 = screenSpace[0].m_data[0];
    fVar20 = screenSpace[0].m_data[1];
    uVar3 = CONCAT44(~-(uint)(fVar20 <= fVar33) & (uint)fVar33,
                     ~-(uint)(fVar21 <= fVar32) & (uint)fVar32) |
            CONCAT44((uint)fVar20 & -(uint)(fVar20 <= fVar33),
                     (uint)fVar21 & -(uint)(fVar21 <= fVar32));
    fVar18 = (float)uVar3;
    fVar19 = (float)(uVar3 >> 0x20);
    fVar30 = screenSpace[2].m_data[0];
    fVar31 = screenSpace[2].m_data[1];
    uVar15 = -(uint)(fVar18 <= fVar30);
    uVar16 = -(uint)(fVar19 <= fVar31);
    uVar3 = CONCAT44(~uVar16 & (uint)fVar31,~uVar15 & (uint)fVar30) |
            CONCAT44((uint)fVar19 & uVar16,(uint)fVar18 & uVar15);
    fVar18 = floorf((float)(uVar3 >> 0x20));
    local_368 = (float)uVar3;
    fVar19 = floorf(local_368);
    fVar21 = (float)(~-(uint)(fVar32 <= fVar21) & (uint)fVar32 |
                    (uint)fVar21 & -(uint)(fVar32 <= fVar21));
    fVar20 = (float)(~-(uint)(fVar33 <= fVar20) & (uint)fVar33 |
                    (uint)fVar20 & -(uint)(fVar33 <= fVar20));
    uVar15 = -(uint)(fVar30 <= fVar21);
    uVar16 = -(uint)(fVar31 <= fVar20);
    fVar20 = ceilf((float)(~uVar16 & (uint)fVar31 | (uint)fVar20 & uVar16));
    fVar21 = ceilf((float)(~uVar15 & (uint)fVar30 | (uint)fVar21 & uVar15));
    aabb.m_data[0] = (int)fVar19;
    aabb.m_data[1] = (int)fVar18;
    iVar26 = (int)fVar21;
    aabb.m_data[3] = (int)fVar20;
    z = aabb.m_data[1];
    aabb.m_data[2] = iVar26;
    if (aabb.m_data[1] < 1) {
      z = SNORM_INT8;
    }
    while( true ) {
      iVar11 = coverageMap.m_size.m_data[1] + -1;
      if (aabb.m_data[3] < coverageMap.m_size.m_data[1] + -1) {
        iVar11 = aabb.m_data[3];
      }
      if (iVar11 < (int)z) break;
      y_00 = aabb.m_data[0];
      if (aabb.m_data[0] < 1) {
        y_00 = R;
      }
      while( true ) {
        iVar11 = coverageMap.m_size.m_data[0] + -1;
        if (iVar26 < coverageMap.m_size.m_data[0] + -1) {
          iVar11 = iVar26;
        }
        if (iVar11 < (int)y_00) break;
        TextureLevel::getAccess((PixelBufferAccess *)local_1b8,&coverageMap);
        ConstPixelBufferAccess::getPixelUint
                  ((ConstPixelBufferAccess *)screenSpace,(int)(PixelBufferAccess *)local_1b8,y_00,z)
        ;
        if (screenSpace[0].m_data[0] != 0.0) {
          pSVar2 = (scene->triangles).
                   super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_1b8._4_4_ = z;
          local_1b8._0_4_ = y_00;
          CVar6 = calculateTriangleCoverage
                            (pSVar2[lVar12].positions,pSVar2[lVar12].positions + 1,
                             pSVar2[lVar12].positions + 2,(IVec2 *)local_1b8,&local_458,subpixelBits
                             ,iVar7 != 0);
          if (CVar6 == COVERAGE_PARTIAL) {
            bVar4 = anon_unknown_3::pixelOnlyOnASharedEdge
                              ((IVec2 *)local_1b8,
                               (scene->triangles).
                               super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar12,&local_458);
            uVar15 = 1;
            if (bVar4) {
              lVar14 = 0;
              lVar13 = 0;
              while( true ) {
                pSVar2 = (scene->triangles).
                         super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                lVar10 = (long)(int)(((long)(scene->triangles).
                                            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pSVar2) / 100);
                if (lVar10 <= lVar13) break;
                if (local_438 != lVar14) {
                  bVar4 = anon_unknown_3::pixelOnlyOnASharedEdge
                                    ((IVec2 *)local_1b8,
                                     (SceneTriangle *)((long)pSVar2->positions[0].m_data + lVar14),
                                     &local_458);
                  if (bVar4) break;
                }
                lVar13 = lVar13 + 1;
                lVar14 = lVar14 + 100;
              }
              uVar15 = (uint)(lVar10 <= lVar13);
              subpixelBits = local_444;
            }
            TextureLevel::getAccess((PixelBufferAccess *)local_1b8,&coverageMap);
            screenSpace._0_16_ = ZEXT416(uVar15);
            PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_1b8,(IVec4 *)screenSpace,y_00,z,0);
          }
          else if (CVar6 == COVERAGE_FULL) {
            TextureLevel::getAccess((PixelBufferAccess *)local_1b8,&coverageMap);
            screenSpace[0].m_data[0] = 0.0;
            screenSpace[0].m_data[1] = 0.0;
            screenSpace[1].m_data[0] = 0.0;
            screenSpace[1].m_data[1] = 0.0;
            PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_1b8,(IVec4 *)screenSpace,y_00,z,0);
          }
        }
        y_00 = y_00 + A;
        iVar26 = aabb.m_data[2];
      }
      z = z + SNORM_INT16;
    }
    lVar12 = lVar12 + 1;
    local_438 = local_438 + 100;
  }
  Surface::getAccess((PixelBufferAccess *)local_1b8,&errorMask);
  screenSpace._0_16_ = ZEXT816(0x3f80000000000000) << 0x40;
  clear((PixelBufferAccess *)local_1b8,(Vec4 *)screenSpace);
  iVar26 = 0;
  iVar7 = 0;
  for (iVar11 = 0; iVar11 < surface->m_height; iVar11 = iVar11 + 1) {
    for (y = 0; y < surface->m_width; y = y + 1) {
      aabb.m_data[0] =
           *(int *)((long)(surface->m_pixels).m_ptr + (long)(surface->m_width * iVar11 + y) * 4);
      redBits = args->redBits;
      greenBits = args->greenBits;
      blueBits = args->blueBits;
      bVar4 = anon_unknown_3::compareColors
                        ((RGBA *)&aabb,&backGroundColor,redBits,greenBits,blueBits);
      bVar5 = anon_unknown_3::compareColors((RGBA *)&aabb,&triangleColor,redBits,greenBits,blueBits)
      ;
      TextureLevel::getAccess((PixelBufferAccess *)local_1b8,&coverageMap);
      ConstPixelBufferAccess::getPixelUint
                ((ConstPixelBufferAccess *)screenSpace,(int)(PixelBufferAccess *)local_1b8,y,iVar11)
      ;
      if (screenSpace[0].m_data[0] == 0.0) {
        uVar8 = 0xffff00ff;
        if (bVar5) {
          uVar8 = 0xff1e1e1e;
        }
        iVar26 = iVar26 + (uint)!bVar5;
LAB_0162b726:
        *(undefined4 *)((long)errorMask.m_pixels.m_ptr + (long)(errorMask.m_width * iVar11 + y) * 4)
             = uVar8;
      }
      else {
        if (screenSpace[0].m_data[0] == 1.4013e-45) {
          uVar8 = 0xff00ffff;
          goto LAB_0162b726;
        }
        if ((screenSpace[0].m_data[0] == 2.8026e-45) && (!bVar4)) {
          iVar7 = iVar7 + 1;
          uVar8 = 0xff0000ff;
          goto LAB_0162b726;
        }
      }
    }
  }
  pSVar9 = surface;
  local_1b8 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
  std::operator<<((ostream *)&local_1b0,"Verifying rasterization result.");
  MessageBuilder::operator<<((MessageBuilder *)local_1b8,(EndMessageToken *)&TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
  iVar11 = (int)log;
  if (local_448 == VERIFICATIONMODE_WEAK) {
    if (iVar7 + iVar26 < 0xb) goto LAB_0162ba0a;
  }
  else if ((local_448 != VERIFICATIONMODE_STRICT) || (iVar7 + iVar26 < 1)) {
LAB_0162ba0a:
    local_1b8 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    std::operator<<((ostream *)&local_1b0,"No invalid pixels found.");
    MessageBuilder::operator<<((MessageBuilder *)local_1b8,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&aabb,"Verification result",(allocator<char> *)&local_288);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"Result of rendering",(allocator<char> *)&local_2a8);
    LogImageSet::LogImageSet((LogImageSet *)screenSpace,(string *)&aabb,&local_3c0);
    LogImageSet::write((LogImageSet *)screenSpace,iVar11,__buf_02,(size_t)pSVar9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"Result",(allocator<char> *)&local_2c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_400,"Result",(allocator<char> *)&local_450);
    LogImage::LogImage((LogImage *)local_1b8,&local_3e0,&local_400,surface,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_1b8,iVar11,__buf_03,(size_t)surface);
    TestLog::endImageSet(log);
    LogImage::~LogImage((LogImage *)local_1b8);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::~string((string *)&local_3e0);
    LogImageSet::~LogImageSet((LogImageSet *)screenSpace);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&aabb);
    bVar4 = true;
    goto LAB_0162bb71;
  }
  local_1b8 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
  std::operator<<((ostream *)&local_1b0,"Invalid pixels found:\n\t");
  std::ostream::operator<<((ostringstream *)&local_1b0,iVar26);
  std::operator<<((ostream *)&local_1b0," missing pixels. (Marked with purple)\n\t");
  std::ostream::operator<<((ostringstream *)&local_1b0,iVar7);
  std::operator<<((ostream *)&local_1b0," incorrectly filled pixels. (Marked with red)\n\t");
  std::operator<<((ostream *)&local_1b0,"Unknown (subpixel on edge) pixels are marked with yellow.")
  ;
  MessageBuilder::operator<<((MessageBuilder *)local_1b8,(EndMessageToken *)&TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"Verification result",(allocator<char> *)&local_450);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e0,"Result of rendering",(allocator<char> *)&local_418);
  LogImageSet::LogImageSet((LogImageSet *)&aabb,&local_3c0,&local_3e0);
  LogImageSet::write((LogImageSet *)&aabb,iVar11,__buf,(size_t)pSVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,"Result",(allocator<char> *)&local_408);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"Result",(allocator<char> *)&local_410);
  LogImage::LogImage((LogImage *)local_1b8,&local_400,&local_288,surface,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
  LogImage::write((LogImage *)local_1b8,iVar11,__buf_00,(size_t)surface);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"ErrorMask",(allocator<char> *)&local_420);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,"ErrorMask",(allocator<char> *)&local_428);
  pSVar9 = &errorMask;
  LogImage::LogImage((LogImage *)screenSpace,&local_2a8,&local_2c8,pSVar9,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
  LogImage::write((LogImage *)screenSpace,iVar11,__buf_01,(size_t)pSVar9);
  TestLog::endImageSet(log);
  LogImage::~LogImage((LogImage *)screenSpace);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2a8);
  LogImage::~LogImage((LogImage *)local_1b8);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_400);
  LogImageSet::~LogImageSet((LogImageSet *)&aabb);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_3c0);
  bVar4 = false;
LAB_0162bb71:
  Surface::~Surface(&errorMask);
  TextureLevel::~TextureLevel(&coverageMap);
  return bVar4;
}

Assistant:

bool verifyTriangleGroupRasterization (const tcu::Surface& surface, const TriangleSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log, VerificationMode mode)
{
	DE_ASSERT(mode < VERIFICATIONMODE_LAST);

	const tcu::RGBA		backGroundColor				= tcu::RGBA(0, 0, 0, 255);
	const tcu::RGBA		triangleColor				= tcu::RGBA(255, 255, 255, 255);
	const tcu::RGBA		missingPixelColor			= tcu::RGBA(255, 0, 255, 255);
	const tcu::RGBA		unexpectedPixelColor		= tcu::RGBA(255, 0, 0, 255);
	const tcu::RGBA		partialPixelColor			= tcu::RGBA(255, 255, 0, 255);
	const tcu::RGBA		primitivePixelColor			= tcu::RGBA(30, 30, 30, 255);
	const int			weakVerificationThreshold	= 10;
	const bool			multisampled				= (args.numSamples != 0);
	const tcu::IVec2	viewportSize				= tcu::IVec2(surface.getWidth(), surface.getHeight());
	int					missingPixels				= 0;
	int					unexpectedPixels			= 0;
	int					subPixelBits				= args.subpixelBits;
	tcu::TextureLevel	coverageMap					(tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::UNSIGNED_INT8), surface.getWidth(), surface.getHeight());
	tcu::Surface		errorMask					(surface.getWidth(), surface.getHeight());

	// subpixel bits in in a valid range?

	if (subPixelBits < 0)
	{
		log << tcu::TestLog::Message << "Invalid subpixel count (" << subPixelBits << "), assuming 0" << tcu::TestLog::EndMessage;
		subPixelBits = 0;
	}
	else if (subPixelBits > 16)
	{
		// At high subpixel bit counts we might overflow. Checking at lower bit count is ok, but is less strict
		log << tcu::TestLog::Message << "Subpixel count is greater than 16 (" << subPixelBits << "). Checking results using less strict 16 bit requirements. This may produce false positives." << tcu::TestLog::EndMessage;
		subPixelBits = 16;
	}

	// generate coverage map

	tcu::clear(coverageMap.getAccess(), tcu::IVec4(COVERAGE_NONE, 0, 0, 0));

	for (int triNdx = 0; triNdx < (int)scene.triangles.size(); ++triNdx)
	{
		const tcu::IVec4 aabb = getTriangleAABB(scene.triangles[triNdx], viewportSize);

		for (int y = de::max(0, aabb.y()); y <= de::min(aabb.w(), coverageMap.getHeight() - 1); ++y)
		for (int x = de::max(0, aabb.x()); x <= de::min(aabb.z(), coverageMap.getWidth() - 1); ++x)
		{
			if (coverageMap.getAccess().getPixelUint(x, y).x() == COVERAGE_FULL)
				continue;

			const CoverageType coverage = calculateTriangleCoverage(scene.triangles[triNdx].positions[0],
																	scene.triangles[triNdx].positions[1],
																	scene.triangles[triNdx].positions[2],
																	tcu::IVec2(x, y),
																	viewportSize,
																	subPixelBits,
																	multisampled);

			if (coverage == COVERAGE_FULL)
			{
				coverageMap.getAccess().setPixel(tcu::IVec4(COVERAGE_FULL, 0, 0, 0), x, y);
			}
			else if (coverage == COVERAGE_PARTIAL)
			{
				CoverageType resultCoverage = COVERAGE_PARTIAL;

				// Sharing an edge with another triangle?
				// There should always be such a triangle, but the pixel in the other triangle might be
				// on multiple edges, some of which are not shared. In these cases the coverage cannot be determined.
				// Assume full coverage if the pixel is only on a shared edge in shared triangle too.
				if (pixelOnlyOnASharedEdge(tcu::IVec2(x, y), scene.triangles[triNdx], viewportSize))
				{
					bool friendFound = false;
					for (int friendTriNdx = 0; friendTriNdx < (int)scene.triangles.size(); ++friendTriNdx)
					{
						if (friendTriNdx != triNdx && pixelOnlyOnASharedEdge(tcu::IVec2(x, y), scene.triangles[friendTriNdx], viewportSize))
						{
							friendFound = true;
							break;
						}
					}

					if (friendFound)
						resultCoverage = COVERAGE_FULL;
				}

				coverageMap.getAccess().setPixel(tcu::IVec4(resultCoverage, 0, 0, 0), x, y);
			}
		}
	}

	// check pixels

	tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	for (int y = 0; y < surface.getHeight(); ++y)
	for (int x = 0; x < surface.getWidth(); ++x)
	{
		const tcu::RGBA		color				= surface.getPixel(x, y);
		const bool			imageNoCoverage		= compareColors(color, backGroundColor, args.redBits, args.greenBits, args.blueBits);
		const bool			imageFullCoverage	= compareColors(color, triangleColor, args.redBits, args.greenBits, args.blueBits);
		CoverageType		referenceCoverage	= (CoverageType)coverageMap.getAccess().getPixelUint(x, y).x();

		switch (referenceCoverage)
		{
			case COVERAGE_NONE:
				if (!imageNoCoverage)
				{
					// coverage where there should not be
					++unexpectedPixels;
					errorMask.setPixel(x, y, unexpectedPixelColor);
				}
				break;

			case COVERAGE_PARTIAL:
				// anything goes
				errorMask.setPixel(x, y, partialPixelColor);
				break;

			case COVERAGE_FULL:
				if (!imageFullCoverage)
				{
					// no coverage where there should be
					++missingPixels;
					errorMask.setPixel(x, y, missingPixelColor);
				}
				else
				{
					errorMask.setPixel(x, y, primitivePixelColor);
				}
				break;

			default:
				DE_ASSERT(false);
		};
	}

	// Output results
	log << tcu::TestLog::Message << "Verifying rasterization result." << tcu::TestLog::EndMessage;

	if (((mode == VERIFICATIONMODE_STRICT) && (missingPixels + unexpectedPixels > 0)) ||
		((mode == VERIFICATIONMODE_WEAK)   && (missingPixels + unexpectedPixels > weakVerificationThreshold)))
	{
		log << tcu::TestLog::Message << "Invalid pixels found:\n\t"
			<< missingPixels << " missing pixels. (Marked with purple)\n\t"
			<< unexpectedPixels << " incorrectly filled pixels. (Marked with red)\n\t"
			<< "Unknown (subpixel on edge) pixels are marked with yellow."
			<< tcu::TestLog::EndMessage;
		log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
			<< tcu::TestLog::Image("Result",	"Result",		surface)
			<< tcu::TestLog::Image("ErrorMask", "ErrorMask",	errorMask)
			<< tcu::TestLog::EndImageSet;

		return false;
	}
	else
	{
		log << tcu::TestLog::Message << "No invalid pixels found." << tcu::TestLog::EndMessage;
		log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
			<< tcu::TestLog::Image("Result", "Result", surface)
			<< tcu::TestLog::EndImageSet;

		return true;
	}
}